

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O2

int32_t decodeBocu1LeadByte(int32_t b)

{
  int iVar1;
  int iVar2;
  
  if (b < 0x50) {
    if (0x24 < b) {
      iVar1 = b * 0xf3 + -0x4c30;
      goto LAB_002ad055;
    }
    if (b < 0x22) {
      iVar2 = 3;
      iVar1 = -0xddcf77;
      goto LAB_002ad081;
    }
    iVar1 = b * 0xe6a9 + -0x217f7e;
  }
  else {
    if ((uint)b < 0xfb) {
      iVar1 = b * 0xf3 + -0xc530;
LAB_002ad055:
      iVar2 = 1;
      goto LAB_002ad081;
    }
    if (0xfd < (uint)b) {
      iVar2 = 3;
      iVar1 = 0x2dd0c;
      goto LAB_002ad081;
    }
    iVar1 = b * 0xe6a9 + -0xe1fea2;
  }
  iVar2 = 2;
LAB_002ad081:
  return iVar2 + iVar1 * 4;
}

Assistant:

static inline int32_t
decodeBocu1LeadByte(int32_t b) {
    int32_t diff, count;

    if(b>=BOCU1_START_NEG_2) {
        /* positive difference */
        if(b<BOCU1_START_POS_3) {
            /* two bytes */
            diff=((int32_t)b-BOCU1_START_POS_2)*BOCU1_TRAIL_COUNT+BOCU1_REACH_POS_1+1;
            count=1;
        } else if(b<BOCU1_START_POS_4) {
            /* three bytes */
            diff=((int32_t)b-BOCU1_START_POS_3)*BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT+BOCU1_REACH_POS_2+1;
            count=2;
        } else {
            /* four bytes */
            diff=BOCU1_REACH_POS_3+1;
            count=3;
        }
    } else {
        /* negative difference */
        if(b>=BOCU1_START_NEG_3) {
            /* two bytes */
            diff=((int32_t)b-BOCU1_START_NEG_2)*BOCU1_TRAIL_COUNT+BOCU1_REACH_NEG_1;
            count=1;
        } else if(b>BOCU1_MIN) {
            /* three bytes */
            diff=((int32_t)b-BOCU1_START_NEG_3)*BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT+BOCU1_REACH_NEG_2;
            count=2;
        } else {
            /* four bytes */
            diff=-BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT*BOCU1_TRAIL_COUNT+BOCU1_REACH_NEG_3;
            count=3;
        }
    }

    /* return the state for decoding the trail byte(s) */
    return (diff<<2)|count;
}